

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void * worker_thread(void *thread_func_param)

{
  char cVar1;
  ushort uVar2;
  mg_context *ctx;
  _func_void_ptr_mg_context_ptr_int *p_Var3;
  socket *psVar4;
  code *pcVar5;
  size_t sVar6;
  _func_void_mg_context_ptr_int_void_ptr *p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  mg_header *hdr;
  uint64_t uVar17;
  byte *pbVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  void *pvVar23;
  long lVar24;
  ulong uVar25;
  void *pvVar26;
  time_t tVar27;
  ushort **ppuVar28;
  ushort *puVar29;
  char *pcVar30;
  char *pcVar31;
  Elf64_Ehdr *pEVar32;
  ptrdiff_t pVar33;
  size_t __n;
  longlong lVar34;
  int *piVar35;
  tm *__tp;
  char *pcVar36;
  size_t sVar37;
  char *pcVar38;
  char *extraout_RDX;
  char *func;
  long lVar39;
  time_t *t;
  Elf64_Ehdr *pEVar40;
  char *func_00;
  mg_file_stat *extraout_RDX_00;
  char *func_01;
  mg_file_stat *extraout_RDX_01;
  mg_file_stat *extraout_RDX_02;
  mg_file_stat *filep;
  char *func_02;
  mg_http_method_info *m;
  pthread_mutex_t *__mutex;
  undefined8 *puVar41;
  ulong uVar42;
  mg_http_method_info *pmVar43;
  char *pcVar44;
  char *pcVar45;
  mg_connection *pmVar46;
  char *in_R9;
  int i;
  uint uVar47;
  char *pcVar48;
  int cnt;
  char *pcVar49;
  pthread_cond_t *__cond;
  byte *pbVar50;
  bool bVar51;
  double dVar52;
  Elf64_Ehdr *pEStack_42a0;
  mg_connection *conn;
  int local_4274;
  Elf64_Ehdr *local_4270;
  int local_4264;
  mg_header *local_4260;
  mg_file file;
  mg_handler_info *handler_info;
  usa *local_4220;
  undefined8 *local_4218;
  mg_request_handler callback_handler;
  int local_4204;
  char mult;
  undefined7 uStack_41ff;
  size_t local_41f8;
  void *auth_callback_data;
  mg_authorization_handler auth_handler;
  void *callback_data;
  time_t *local_41d8;
  undefined8 *local_41d0;
  undefined8 *local_41c8;
  char *local_41c0;
  pthread_cond_t *local_41b8;
  pthread_cond_t *local_41b0;
  pthread_mutex_t *local_41a8;
  time_t curtime;
  mg_websocket_close_handler ws_close_handler;
  mg_websocket_data_handler ws_data_handler;
  mg_websocket_ready_handler ws_ready_handler;
  mg_websocket_connect_handler ws_connect_handler;
  vec filename_vec;
  char ebuf [100];
  undefined4 local_40f8 [2];
  ulong local_40f0;
  void *local_40e8;
  undefined8 local_40e0;
  mg_websocket_subprotocols *subprotocols;
  _union_1457 local_40d0;
  undefined1 local_40c8 [144];
  vec vec;
  char local_2039;
  char path [4096];
  vec val;
  
  pvVar23 = (void *)0x0;
  memset(local_40c8,0,0x90);
  local_40d0 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_40d0,(sigaction *)0x0);
  ctx = *(mg_context **)((long)thread_func_param + 0x8e0);
  mg_set_thread_name("worker");
  local_40f8[0] = 0;
  LOCK();
  UNLOCK();
  local_40f0 = (ulong)((int)thread_idx_max + 1);
  thread_idx_max = thread_idx_max + 1;
  pthread_setspecific(sTlsKey,local_40f8);
  p_Var3 = (ctx->callbacks).init_thread;
  if (p_Var3 != (_func_void_ptr_mg_context_ptr_int *)0x0) {
    pvVar23 = (*p_Var3)(ctx,1);
  }
  lVar24 = (long)thread_func_param - (long)ctx->worker_connections;
  uVar20 = 0x9e8;
  uVar25 = lVar24 / 0x9e8;
  pcVar38 = (char *)(lVar24 % 0x9e8);
  uVar47 = (uint)uVar25;
  local_40e8 = pvVar23;
  if (((int)uVar47 < 0) || (ctx->cfg_worker_threads <= uVar47)) {
    pcVar30 = "Internal error: Invalid worker index %i";
  }
  else {
    uVar47 = ctx->max_request_size;
    uVar20 = 0x9e8;
    pvVar26 = malloc((ulong)uVar47);
    *(void **)((long)thread_func_param + 0x970) = pvVar26;
    if (pvVar26 != (void *)0x0) {
      *(uint *)((long)thread_func_param + 0x990) = uVar47;
      *(mg_domain_context **)((long)thread_func_param + 0x8e8) = &ctx->dd;
      *(void **)((long)thread_func_param + 0x9e0) = pvVar23;
      *(void **)((long)thread_func_param + 0x90) = ctx->user_data;
      iVar19 = pthread_mutex_init((pthread_mutex_t *)((long)thread_func_param + 0x9b8),
                                  (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar19 != 0) {
        free(*(void **)((long)thread_func_param + 0x970));
        mg_cry_internal_wrap((mg_connection *)0x0,ctx,func,uVar20,"%s","Cannot create mutex");
        return (void *)0x0;
      }
      local_41d0 = (undefined8 *)((long)thread_func_param + 0x8f8);
      __mutex = (pthread_mutex_t *)&ctx->thread_mutex;
      __cond = (pthread_cond_t *)&ctx->sq_full;
      local_41b8 = (pthread_cond_t *)&ctx->sq_empty;
      local_41d8 = (time_t *)((long)thread_func_param + 0x938);
      local_4220 = (usa *)((long)thread_func_param + 0x918);
      local_41c0 = (char *)((long)thread_func_param + 0x48);
      local_4218 = (undefined8 *)((long)thread_func_param + 0x10);
      local_4260 = (mg_header *)((long)thread_func_param + 0xa8);
      local_41c8 = (undefined8 *)((long)thread_func_param + 0xb0);
      local_41b0 = __cond;
      local_41a8 = __mutex;
LAB_001143c6:
      do {
        pthread_mutex_lock(__mutex);
        while ((ctx->sq_head == ctx->sq_tail && (ctx->stop_flag == 0))) {
          pthread_cond_wait(__cond,__mutex);
        }
        if (ctx->sq_tail < ctx->sq_head) {
          psVar4 = ctx->squeue;
          iVar19 = ctx->sq_tail % ctx->sq_size;
          uVar8 = *(undefined8 *)(psVar4 + iVar19);
          uVar9 = *(undefined8 *)((long)&psVar4[iVar19].lsa + 4);
          puVar41 = (undefined8 *)((long)&psVar4[iVar19].lsa + 0xc);
          uVar10 = *puVar41;
          uVar11 = puVar41[1];
          uVar12 = *(undefined8 *)&psVar4[iVar19].rsa;
          uVar13 = *(undefined8 *)((long)&psVar4[iVar19].rsa + 8);
          puVar41 = (undefined8 *)((long)&psVar4[iVar19].rsa + 0x10);
          uVar14 = puVar41[1];
          local_41d0[6] = *puVar41;
          local_41d0[7] = uVar14;
          local_41d0[4] = uVar12;
          local_41d0[5] = uVar13;
          local_41d0[2] = uVar10;
          local_41d0[3] = uVar11;
          *local_41d0 = uVar8;
          local_41d0[1] = uVar9;
          ctx->sq_tail = ctx->sq_tail + 1;
          iVar19 = ctx->sq_size;
          while (iVar19 < ctx->sq_tail) {
            ctx->sq_tail = ctx->sq_tail - iVar19;
            ctx->sq_head = ctx->sq_head - iVar19;
          }
        }
        pthread_cond_signal(local_41b8);
        pthread_mutex_unlock(__mutex);
        if (ctx->stop_flag != 0) {
          p_Var7 = (ctx->callbacks).exit_thread;
          if (p_Var7 != (_func_void_mg_context_ptr_int_void_ptr *)0x0) {
            (*p_Var7)(ctx,1,local_40e8);
          }
          pthread_setspecific(sTlsKey,(void *)0x0);
          pthread_mutex_destroy((pthread_mutex_t *)((long)thread_func_param + 0x9b8));
          *(undefined4 *)((long)thread_func_param + 0x990) = 0;
          free(*(void **)((long)thread_func_param + 0x970));
          *(undefined8 *)((long)thread_func_param + 0x970) = 0;
          if (*(void **)((long)thread_func_param + 0x28) ==
              *(void **)((long)thread_func_param + 0x20)) {
            return (void *)0x0;
          }
          free(*(void **)((long)thread_func_param + 0x28));
          *(undefined8 *)((long)thread_func_param + 0x28) = 0;
          return (void *)0x0;
        }
        local_40e0 = 0;
        tVar27 = time((time_t *)0x0);
        *(time_t *)((long)thread_func_param + 0x938) = tVar27;
        *(uint *)((long)thread_func_param + 0x80) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x91a) << 8 |
                           *(ushort *)((long)thread_func_param + 0x91a) >> 8);
        *(uint *)((long)thread_func_param + 0x84) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                           *(ushort *)((long)thread_func_param + 0x8fe) >> 8);
        sockaddr_to_string(local_41c0,0x30,local_4220);
        *(uint *)((long)thread_func_param + 0x88) = (uint)*(byte *)((long)thread_func_param + 0x934)
        ;
      } while (*(byte *)((long)thread_func_param + 0x934) != 0);
      iVar19 = mg_strcasecmp(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x58),"yes");
      if (iVar19 != 0) {
        *(undefined4 *)((long)thread_func_param + 0x980) = 1;
      }
      *(undefined4 *)((long)thread_func_param + 0x998) = 0;
      *(undefined4 *)((long)thread_func_param + 0x98c) = 0;
      *(undefined4 *)thread_func_param = 0;
      *(undefined8 *)((long)thread_func_param + 0x4b0) = 0;
      *(undefined8 *)((long)thread_func_param + 0x98) = 0;
      pcVar5 = *(code **)(*(int **)((long)thread_func_param + 0x8e0) + 0xa0e6);
      if ((pcVar5 != (code *)0x0) && (**(int **)((long)thread_func_param + 0x8e0) == 1)) {
        vec.ptr = (char *)0x0;
        (*pcVar5)(thread_func_param,&vec);
        *(char **)((long)thread_func_param + 0x98) = vec.ptr;
      }
      *(undefined4 *)((long)thread_func_param + 4) = 0;
LAB_0011458f:
      *(undefined4 *)thread_func_param = 1;
      iVar19 = get_message((mg_connection *)thread_func_param,ebuf,100,&local_4274);
      pcVar38 = in_R9;
      if (iVar19 == 0) {
        iVar19 = local_4274;
        if (0 < local_4274) goto LAB_001146b7;
      }
      else {
        pbVar50 = *(byte **)((long)thread_func_param + 0x970);
        uVar20 = *(uint *)((long)thread_func_param + 0x990);
        *(undefined8 *)((long)thread_func_param + 0x30) = 0;
        *(undefined8 *)((long)thread_func_param + 0x40) = 0;
        *(undefined4 *)((long)thread_func_param + 0xa0) = 0;
        *local_4218 = 0;
        local_4218[1] = 0;
        for (uVar47 = uVar20; 0 < (int)uVar47; uVar47 = uVar47 - 1) {
          ppuVar28 = __ctype_b_loc();
          puVar29 = *ppuVar28;
          pbVar18 = pbVar50;
          if ((*(byte *)((long)puVar29 + (ulong)*pbVar50 * 2 + 1) & 0x20) == 0) goto LAB_00114644;
          pbVar50 = pbVar50 + 1;
        }
        vec.ptr = (char *)pbVar50;
        if ((int)uVar20 < 0) {
          ppuVar28 = __ctype_b_loc();
          puVar29 = *ppuVar28;
          uVar47 = (int)uVar20 >> 0x1f & uVar20;
          pbVar18 = (byte *)vec.ptr;
LAB_00114644:
          vec.ptr = (char *)pbVar18;
          if (((puVar29[*pbVar50] & 2) == 0) &&
             (uVar20 = get_http_header_len((char *)pbVar50,uVar47), 0 < (int)uVar20)) {
            pbVar50[(ulong)uVar20 - 1] = 0;
            if ((0xd < *pbVar50) || ((0x2401U >> (*pbVar50 & 0x1f) & 1) == 0)) {
              *local_4218 = pbVar50;
              iVar19 = skip_to_end_of_word_and_terminate(&vec.ptr,0);
              if (0 < iVar19) {
                *(char **)((long)thread_func_param + 0x18) = vec.ptr;
                iVar19 = skip_to_end_of_word_and_terminate(&vec.ptr,0);
                if (0 < iVar19) {
                  *(char **)((long)thread_func_param + 0x30) = vec.ptr;
                  iVar19 = skip_to_end_of_word_and_terminate(&vec.ptr,1);
                  if (0 < iVar19) {
                    pcVar30 = *(char **)((long)thread_func_param + 0x30);
                    iVar19 = strncmp(pcVar30,"HTTP/",5);
                    if (iVar19 == 0) {
                      *(char **)((long)thread_func_param + 0x30) = pcVar30 + 5;
                      pcVar30 = *(char **)((long)thread_func_param + 0x10);
                      pmVar43 = http_methods;
                      do {
                        if (pmVar43->name == (char *)0x0) goto LAB_0011467f;
                        iVar19 = strcmp(pmVar43->name,pcVar30);
                        pmVar43 = pmVar43 + 1;
                      } while (iVar19 != 0);
                      iVar19 = parse_http_headers(&vec.ptr,local_4260);
                      *(int *)((long)thread_func_param + 0xa0) = iVar19;
                      if (-1 < iVar19) {
                        pcVar30 = get_header(local_4260,iVar19,"Host");
                        if (pcVar30 != (char *)0x0) {
                          if (*pcVar30 == '[') {
                            pcVar31 = strchr(pcVar30,0x5d);
                            if (pcVar31 == (char *)0x0) goto LAB_00115488;
                            pcVar31 = pcVar31 + (1 - (long)pcVar30);
                          }
                          else {
                            pcVar31 = strchr(pcVar30,0x3a);
                            if (pcVar31 == (char *)0x0) {
                              pcVar31 = (char *)strlen(pcVar30);
                            }
                            else {
                              pcVar31 = pcVar31 + -(long)pcVar30;
                            }
                          }
                          if (*(long *)((long)thread_func_param + 0x8f0) == 0) {
                            lVar24 = *(long *)((long)thread_func_param + 0x8e0) + 0x283a8;
                            while (lVar24 != 0) {
                              pcVar36 = *(char **)(lVar24 + 0xf8);
                              pcVar49 = (char *)strlen(pcVar36);
                              if ((pcVar49 == pcVar31) &&
                                 (iVar19 = mg_strncasecmp(pcVar30,pcVar36,(size_t)pcVar31),
                                 iVar19 == 0)) {
                                *(long *)((long)thread_func_param + 0x8e8) = lVar24;
                                break;
                              }
                              mg_lock_context(*(mg_context **)((long)thread_func_param + 0x8e0));
                              lVar24 = *(long *)(lVar24 + 0x1f8);
                              mg_unlock_context(*(mg_context **)((long)thread_func_param + 0x8e0));
                            }
                            goto LAB_00115488;
                          }
                          pcVar36 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8);
                          if (((pcVar36 == (char *)0x0) ||
                              (*(long *)((long)thread_func_param + 0x8e8) ==
                               *(long *)((long)thread_func_param + 0x8e0) + 0x283a8)) ||
                             ((pcVar49 = (char *)strlen(pcVar36), pcVar49 == pcVar31 &&
                              (iVar19 = mg_strncasecmp(pcVar30,pcVar36,(size_t)pcVar31), iVar19 == 0
                              )))) goto LAB_00115488;
                          in_R9 = "Bad request: Host mismatch";
LAB_001154fa:
                          mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s");
                          local_4274 = 400;
                          iVar19 = local_4274;
                          goto LAB_001146b7;
                        }
LAB_00115488:
                        iVar19 = *(int *)((long)thread_func_param + 0xa0);
                        pcVar30 = get_header(local_4260,iVar19,"Transfer-Encoding");
                        if ((pcVar30 == (char *)0x0) ||
                           (iVar21 = mg_strcasecmp(pcVar30,"identity"), iVar21 == 0)) {
                          pcVar30 = get_header(local_4260,iVar19,"Content-Length");
                          if (pcVar30 == (char *)0x0) goto LAB_001155c2;
                          vec.ptr = (char *)0x0;
                          lVar34 = strtoll(pcVar30,&vec.ptr,10);
                          *(longlong *)((long)thread_func_param + 0x958) = lVar34;
                          if (lVar34 < 0 || vec.ptr == pcVar30) {
                            in_R9 = "Bad request";
                            mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s")
                            ;
                            local_4274 = 0x19b;
                            iVar19 = local_4274;
                            goto LAB_001146b7;
                          }
                          *(longlong *)((long)thread_func_param + 0x78) = lVar34;
                        }
                        else {
                          iVar19 = mg_strcasecmp(pcVar30,"chunked");
                          if (iVar19 != 0) {
                            in_R9 = "Bad request";
                            goto LAB_001154fa;
                          }
                          *(undefined4 *)((long)thread_func_param + 0x968) = 1;
LAB_001155c2:
                          *(undefined8 *)((long)thread_func_param + 0x958) = 0;
                        }
                        in_R9 = *(char **)((long)thread_func_param + 0x30);
                        iVar19 = strcmp(in_R9,"1.0");
                        if ((iVar19 != 0) && (iVar19 = strcmp(in_R9,"1.1"), iVar19 != 0)) {
                          mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,
                                      "Bad HTTP version: [%s]");
                          iVar19 = 0x1f9;
                          goto LAB_001146b7;
                        }
                        goto LAB_001146c8;
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0011467f:
        in_R9 = "Bad request";
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s");
        local_4274 = 400;
        iVar19 = local_4274;
LAB_001146b7:
        mg_send_http_error((mg_connection *)thread_func_param,iVar19,"%s");
        pcVar38 = in_R9;
      }
LAB_001146c8:
      if (ebuf[0] == '\0') {
        pEVar40 = *(Elf64_Ehdr **)((long)thread_func_param + 0x18);
        pEVar32 = pEVar40;
        if ((pEVar40->e_ident_magic_num != 0x2a) || (pEVar40->e_ident_magic_str[0] != '\0')) {
          do {
            pbVar50 = &pEVar32->e_ident_magic_num;
            if (*pbVar50 == 0) {
              pEVar32 = pEVar40;
              if (pEVar40->e_ident_magic_num == 0x2f) goto LAB_00114752;
              lVar24 = 8;
              goto LAB_0011493f;
            }
            pEVar32 = (Elf64_Ehdr *)pEVar32->e_ident_magic_str;
          } while (' ' < (char)*pbVar50);
          goto LAB_001146f9;
        }
        goto LAB_00114738;
      }
      goto LAB_00114768;
    }
    pcVar30 = "Out of memory: Cannot allocate buffer for worker %i";
    pcVar38 = extraout_RDX;
  }
  mg_cry_internal_wrap((mg_connection *)0x0,ctx,pcVar38,uVar20,pcVar30,uVar25 & 0xffffffff);
  return (void *)0x0;
  while( true ) {
    sVar6 = *(size_t *)((long)&abs_uri_protocols[0].proto + lVar24);
    iVar19 = mg_strncasecmp((char *)pEVar40,
                            *(char **)((long)&http_methods[0x10].is_cacheable + lVar24),sVar6);
    lVar24 = lVar24 + 0x18;
    if (iVar19 == 0) break;
LAB_0011493f:
    if (lVar24 + 0x18 == 0x80) goto LAB_001146f9;
  }
  pcVar30 = strchr((char *)(&pEVar40->e_ident_magic_num + sVar6),0x2f);
  if (pcVar30 == (char *)0x0) {
LAB_001146f9:
    mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"Invalid URI");
    mg_send_http_error((mg_connection *)thread_func_param,400,"%s");
LAB_00114738:
    pEVar32 = (Elf64_Ehdr *)0x0;
    goto LAB_00114752;
  }
  pcVar31 = strchr((char *)(&pEVar40->e_ident_magic_num + sVar6),0x3a);
  if (pcVar31 != (char *)0x0) {
    uVar25 = strtoul(pcVar31 + 1,&vec.ptr,10);
    if ((vec.ptr != pcVar30) || (uVar25 - 0x10000 < 0xffffffffffff0001)) goto LAB_001146f9;
    pEVar40 = *(Elf64_Ehdr **)((long)thread_func_param + 0x18);
  }
  iVar19 = mg_strcasecmp(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x100),"yes");
  lVar24 = 0;
  do {
    lVar39 = lVar24;
    if (lVar39 + 0x18 == 0x78) goto LAB_0011535a;
    sVar6 = *(size_t *)((long)&abs_uri_protocols[0].proto_len + lVar39);
    iVar21 = mg_strncasecmp((char *)pEVar40,*(char **)((long)&abs_uri_protocols[0].proto + lVar39),
                            sVar6);
    lVar24 = lVar39 + 0x18;
  } while (iVar21 != 0);
  pbVar50 = &pEVar40->e_ident_magic_num + sVar6;
  pEVar32 = (Elf64_Ehdr *)strchr((char *)pbVar50,0x2f);
  if (pEVar32 == (Elf64_Ehdr *)0x0) {
LAB_0011535a:
    pEVar32 = (Elf64_Ehdr *)0x0;
  }
  else {
    local_4270 = pEVar32;
    pEVar32 = (Elf64_Ehdr *)strchr((char *)pbVar50,0x3a);
    if (pEVar32 <= local_4270 && pEVar32 != (Elf64_Ehdr *)0x0) {
      uVar25 = strtoul(pEVar32->e_ident_magic_str,&vec.ptr,10);
      if (0xffffffffffff0000 < uVar25 - 0x10000 && (Elf64_Ehdr *)vec.ptr == local_4270)
      goto LAB_00115285;
      goto LAB_0011535a;
    }
    uVar25 = (ulong)*(uint *)((long)&abs_uri_protocols[0].default_port + lVar39);
    pEVar32 = local_4270;
    if (uVar25 == 0) goto LAB_0011535a;
LAB_00115285:
    uVar42 = (long)pEVar32 - (long)pbVar50;
    if (uVar25 != (ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                          *(ushort *)((long)thread_func_param + 0x8fe) >> 8)) goto LAB_0011535a;
    pEVar32 = local_4270;
    if (iVar19 == 0) {
      pcVar30 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8);
      sVar37 = strlen(pcVar30);
      if (((pEVar40 == (Elf64_Ehdr *)0x0) || (sVar37 == 0)) ||
         (((uVar42 != sVar37 ||
           (iVar19 = bcmp(pcVar30,pbVar50,uVar42), pEVar32 = local_4270, iVar19 != 0)) &&
          (((uVar42 < sVar37 + 2 || (pbVar50[~sVar37 + uVar42] != 0x2e)) ||
           (iVar19 = bcmp(pcVar30,pbVar50 + (uVar42 - sVar37),sVar37), pEVar32 = local_4270,
           iVar19 != 0)))))) goto LAB_0011535a;
    }
  }
LAB_00114752:
  *(Elf64_Ehdr **)((long)thread_func_param + 0x20) = pEVar32;
  *(Elf64_Ehdr **)((long)thread_func_param + 0x28) = pEVar32;
  if (ebuf[0] == '\0') {
    iVar19 = *(int *)((long)thread_func_param + 0xa0);
    lVar24 = 0;
    uVar20 = 0;
    puVar41 = local_41c8;
    while ((lVar24 < iVar19 && ((int)uVar20 < 8))) {
      iVar21 = mg_strcasecmp("Connection",(char *)puVar41[-1]);
      if (iVar21 == 0) {
        lVar39 = (long)(int)uVar20;
        uVar20 = uVar20 + 1;
        (&vec.ptr)[lVar39] = (char *)*puVar41;
      }
      lVar24 = lVar24 + 1;
      puVar41 = puVar41 + 2;
    }
    uVar42 = 0;
    uVar25 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar25 = uVar42;
    }
    bVar15 = false;
    for (; uVar25 != uVar42; uVar42 = uVar42 + 1) {
      pcVar30 = mg_strcasestr((&vec.ptr)[uVar42],"upgrade");
      if (pcVar30 != (char *)0x0) {
        bVar15 = true;
      }
    }
    if (bVar15) {
      pcVar30 = mg_get_header((mg_connection *)thread_func_param,"Upgrade");
      pEStack_42a0 = (Elf64_Ehdr *)0xffffffffffffffff;
      if (pcVar30 != (char *)0x0) {
        pcVar31 = mg_strcasestr(pcVar30,"websocket");
        pEStack_42a0 = (Elf64_Ehdr *)0x1;
        if (pcVar31 == (char *)0x0) {
          pcVar30 = mg_strcasestr(pcVar30,"h2");
          pEStack_42a0 = (Elf64_Ehdr *)0xffffffffffffffff;
          if (pcVar30 != (char *)0x0) {
            pEStack_42a0 = (Elf64_Ehdr *)0x0;
          }
        }
      }
    }
    else {
      pEStack_42a0 = (Elf64_Ehdr *)0x0;
    }
    *(int *)((long)thread_func_param + 4) = (int)pEStack_42a0;
    if (pEVar32 == (Elf64_Ehdr *)0x0) goto LAB_0011476d;
    callback_handler = (mg_request_handler)0x0;
    handler_info = (mg_handler_info *)0x0;
    ws_connect_handler = (mg_websocket_connect_handler)0x0;
    ws_ready_handler = (mg_websocket_ready_handler)0x0;
    ws_data_handler = (mg_websocket_data_handler)0x0;
    ws_close_handler = (mg_websocket_close_handler)0x0;
    callback_data = (void *)0x0;
    auth_handler = (mg_authorization_handler)0x0;
    auth_callback_data = (void *)0x0;
    curtime = time((time_t *)0x0);
    path[0] = '\0';
    *(undefined4 *)((long)thread_func_param + 8) = 0;
    pcVar30 = strchr(*(char **)((long)thread_func_param + 0x18),0x3f);
    *(char **)((long)thread_func_param + 0x38) = pcVar30;
    if (pcVar30 != (char *)0x0) {
      pEStack_42a0 = (Elf64_Ehdr *)(pcVar30 + 1);
      *(Elf64_Ehdr **)((long)thread_func_param + 0x38) = pEStack_42a0;
      *pcVar30 = '\0';
    }
    if ((*(char *)((long)thread_func_param + 0x934) == '\0') &&
       (*(char *)((long)thread_func_param + 0x935) != '\0')) {
      lVar24 = *(long *)((long)thread_func_param + 0x8e0);
      if (lVar24 != 0) {
        lVar39 = 0x3c;
        uVar25 = 0;
        for (uVar20 = 0xffffffff; uVar20 == 0xffffffff; uVar20 = -(uint)(*pcVar30 == '\0') | uVar20)
        {
          if (*(uint *)(lVar24 + 0x18) == uVar25) goto LAB_0011520d;
          pcVar30 = (char *)(*(long *)(lVar24 + 8) + lVar39);
          uVar20 = (uint)uVar25;
          uVar25 = uVar25 + 1;
          lVar39 = lVar39 + 0x40;
        }
        if (-1 < (int)uVar20) {
          uVar2 = *(ushort *)(*(long *)(lVar24 + 8) + 6 + (ulong)uVar20 * 0x40);
          pEStack_42a0 = (Elf64_Ehdr *)0x129723;
          if (*(int *)((long)thread_func_param + 4) == 1) {
            pEStack_42a0 = (Elf64_Ehdr *)0x129729;
          }
          *(undefined4 *)((long)thread_func_param + 0x980) = 1;
          iVar19 = mg_construct_local_link
                             ((mg_connection *)thread_func_param,(char *)&vec,0x2000,
                              (char *)pEStack_42a0,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8),pcVar38);
          if (iVar19 < 0) {
LAB_001152b3:
            pEStack_42a0 = (Elf64_Ehdr *)0x12ace2;
            mg_send_http_error((mg_connection *)thread_func_param,500,"%s");
          }
          else {
            pcVar30 = *(char **)((long)thread_func_param + 0x38);
            if (pcVar30 != (char *)0x0) {
              sVar37 = strlen((char *)&vec);
              __n = strlen(pcVar30);
              pEStack_42a0 = (Elf64_Ehdr *)(__n + sVar37 + 2);
              if ((Elf64_Ehdr *)0x1fff < pEStack_42a0) goto LAB_001152b3;
              *(undefined1 *)((long)&vec.ptr + sVar37) = 0x3f;
              memcpy((void *)((long)&vec.ptr + sVar37 + 1),pcVar30,__n);
              *(undefined1 *)((long)&vec.ptr + __n + sVar37 + 1) = 0;
            }
            mg_send_http_redirect((mg_connection *)thread_func_param,(char *)&vec,0x134);
          }
          goto LAB_001159cb;
        }
      }
LAB_0011520d:
      pEStack_42a0 = (Elf64_Ehdr *)0x12ab73;
      mg_send_http_error((mg_connection *)thread_func_param,0x1f7,"%s");
      pcVar38 = "Can not redirect to SSL, no SSL port available";
      mg_cry_internal_wrap
                ((mg_connection *)thread_func_param,(mg_context *)0x0,func_00,(uint)pEStack_42a0,
                 "%s");
    }
    else {
      if ((*(long *)((long)thread_func_param + 0x8e8) != 0) &&
         (iVar19 = mg_strcasecmp(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x70),"yes"
                                ), iVar19 == 0)) {
        url_decode_in_place(*(char **)((long)thread_func_param + 0x28));
      }
      pcVar30 = *(char **)((long)thread_func_param + 0x38);
      if (((pcVar30 != (char *)0x0) && (*(long *)((long)thread_func_param + 0x8e8) != 0)) &&
         (iVar19 = mg_strcasecmp(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x78),"yes"
                                ), iVar19 == 0)) {
        url_decode_in_place(pcVar30);
      }
      pcVar30 = mg_strdup(*(char **)((long)thread_func_param + 0x20));
      if (pcVar30 != (char *)0x0) {
        remove_dot_segments(pcVar30);
        *(char **)((long)thread_func_param + 0x28) = pcVar30;
        pcVar31 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x50);
        iVar19 = 0;
LAB_00114c1c:
        pcVar31 = next_option(pcVar31,&vec,&val);
        if (pcVar31 != (char *)0x0) {
          mult = ',';
          if (val.ptr != (char *)0x0) {
            pEStack_42a0 = (Elf64_Ehdr *)&mult;
            iVar21 = __isoc99_sscanf(val.ptr,"%lf%c",&file);
            uVar17 = file.stat.size;
            if ((0 < iVar21) && (0.0 <= (double)file.stat.size)) {
              iVar21 = lowercase(&mult);
              if (iVar21 == 0x6b) {
                dVar52 = 1024.0;
              }
              else {
                if ((iVar21 != 0x6d) && (mult != ',')) goto LAB_00114c1c;
                iVar22 = 1;
                if (iVar21 == 0x6d) {
                  iVar22 = 0x100000;
                }
                dVar52 = (double)iVar22;
                pEStack_42a0 = &std::operator<<char,_std::char_traits<char>,_std::allocator<char>_>;
              }
              file.stat.size = (uint64_t)((double)uVar17 * dVar52);
              if ((vec.len != 1) || (*vec.ptr != '*')) {
                iVar21 = parse_match_net(&vec,local_4220,0);
                if (iVar21 < 0) {
                  pVar33 = match_prefix(vec.ptr,vec.len,pcVar30);
                  if (pVar33 < 1) goto LAB_00114c1c;
                }
                else if (iVar21 == 0) goto LAB_00114c1c;
              }
              iVar19 = (int)(double)file.stat.size;
            }
          }
          goto LAB_00114c1c;
        }
        *(int *)((long)thread_func_param + 0x9a0) = iVar19;
        pcVar5 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28310);
        if (pcVar5 == (code *)0x0) {
LAB_00114f0f:
          iVar19 = strcmp((char *)*local_4218,"OPTIONS");
          hdr = local_4260;
          if (iVar19 == 0) {
            pcVar30 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1a8);
            pcVar38 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b0);
            iVar19 = *(int *)((long)thread_func_param + 0xa0);
            pcVar36 = get_header(local_4260,iVar19,"Origin");
            pcVar31 = get_header(hdr,iVar19,"Access-Control-Request-Method");
            if (((pcVar38 != (char *)0x0) && (pcVar30 != (char *)0x0 && *pcVar38 != '\0')) &&
               ((pcVar31 != (char *)0x0 && pcVar36 != (char *)0x0) && *pcVar30 != '\0')) {
              local_4270 = (Elf64_Ehdr *)
                           get_header(local_4260,iVar19,"Access-Control-Request-Headers");
              gmt_time_string((char *)&vec,(size_t)&curtime,t);
              if (*pcVar38 != '*') {
                pcVar31 = pcVar38;
              }
              pcVar38 = suggest_connection_header((mg_connection *)thread_func_param);
              mg_printf((mg_connection *)thread_func_param,
                        "HTTP/1.1 200 OK\r\nDate: %s\r\nAccess-Control-Allow-Origin: %s\r\nAccess-Control-Allow-Methods: %s\r\nContent-Length: 0\r\nConnection: %s\r\n"
                        ,&vec,pcVar30,pcVar31);
              pEStack_42a0 = local_4270;
              if (((local_4270 != (Elf64_Ehdr *)0x0) &&
                  (pEVar40 = *(Elf64_Ehdr **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b8),
                  pEVar40 != (Elf64_Ehdr *)0x0)) && (pEVar40->e_ident_magic_num != 0)) {
                if (pEVar40->e_ident_magic_num == 0x2a) {
                  pEVar40 = local_4270;
                }
                mg_printf((mg_connection *)thread_func_param,"Access-Control-Allow-Headers: %s\r\n",
                          pEVar40);
              }
              mg_printf((mg_connection *)thread_func_param,"Access-Control-Max-Age: 60\r\n");
              mg_printf((mg_connection *)thread_func_param,"\r\n");
              goto LAB_001159cb;
            }
          }
          iVar19 = *(int *)((long)thread_func_param + 4);
          pcVar38 = (char *)&ws_ready_handler;
          iVar21 = get_request_handler((mg_connection *)thread_func_param,0,&callback_handler,
                                       &subprotocols,&ws_connect_handler,
                                       (mg_websocket_ready_handler *)pcVar38,&ws_data_handler,
                                       &ws_close_handler,(mg_authorization_handler *)0x0,
                                       &callback_data,&handler_info);
          if (iVar21 == 0) goto LAB_00115632;
          bVar51 = iVar19 != 1;
          iVar19 = is_put_or_delete_method((mg_connection *)thread_func_param);
          local_4270 = (Elf64_Ehdr *)CONCAT44(local_4270._4_4_,iVar19);
          bVar15 = true;
          bVar16 = false;
LAB_0011574e:
          do {
            pEStack_42a0 = (Elf64_Ehdr *)0x0;
            pcVar38 = (char *)0x0;
            iVar19 = get_request_handler((mg_connection *)thread_func_param,2,
                                         (mg_request_handler *)0x0,(mg_websocket_subprotocols **)0x0
                                         ,(mg_websocket_connect_handler *)0x0,
                                         (mg_websocket_ready_handler *)0x0,
                                         (mg_websocket_data_handler *)0x0,
                                         (mg_websocket_close_handler *)0x0,&auth_handler,
                                         &auth_callback_data,(mg_handler_info **)0x0);
            if (iVar19 == 0) {
              if (bVar15 || (int)local_4270 == 0) {
                file.access.fp = (FILE *)0x0;
                file.stat.is_directory = 0;
                file.stat.is_gzipped = 0;
                file.stat.location = 0;
                file.stat._28_4_ = 0;
                file.stat.size = 0;
                file.stat.last_modified = 0;
                if (*(long *)((long)thread_func_param + 0x8e8) != 0) {
                  pcVar30 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf0);
                  do {
                    pcVar30 = next_option(pcVar30,(vec *)&mult,&filename_vec);
                    filep = extraout_RDX_00;
                    if (pcVar30 == (char *)0x0) goto LAB_00115982;
                    iVar19 = bcmp(*(void **)((long)thread_func_param + 0x28),
                                  (void *)CONCAT71(uStack_41ff,mult),local_41f8);
                  } while (iVar19 != 0);
                  pcVar38 = (char *)(ulong)(uint)filename_vec.len;
                  mg_snprintf((mg_connection *)thread_func_param,&local_4204,(char *)&val,0x1000,
                              "%.*s",pcVar38,filename_vec.ptr);
                  pEStack_42a0 = (Elf64_Ehdr *)0x115866;
                  if ((local_4204 != 0) ||
                     (iVar19 = mg_fopen((mg_connection *)&val,(char *)0x1,(int)&file,
                                        (mg_file *)0x115866), filep = extraout_RDX_02, iVar19 == 0))
                  {
                    piVar35 = __errno_location();
                    pEStack_42a0 = (Elf64_Ehdr *)strerror(*piVar35);
                    pcVar38 = "check_authorization";
                    mg_cry_internal_wrap
                              ((mg_connection *)thread_func_param,(mg_context *)0x0,func_01,
                               (uint)pEStack_42a0,"%s: cannot open %s: %s","check_authorization",
                               (mg_connection *)&val);
                    filep = extraout_RDX_01;
                  }
LAB_00115982:
                  if (file.access.fp == (FILE *)0x0) {
                    if (*(long *)((long)thread_func_param + 0x8e8) == 0) goto LAB_001157b5;
                    pmVar46 = *(mg_connection **)
                               (*(long *)((long)thread_func_param + 0x8e8) + 0x120);
                    if (pmVar46 == (mg_connection *)0x0) {
                      pEStack_42a0 = (Elf64_Ehdr *)0x115c94;
                      iVar19 = mg_stat((mg_connection *)path,(char *)&file,filep);
                      if ((iVar19 == 0) || (file.stat.is_directory == 0)) {
                        sVar37 = strlen(path);
                        uVar20 = (uint)sVar37;
                        pcVar30 = path + (sVar37 - 1);
                        do {
                          uVar20 = uVar20 - 1;
                          pcVar38 = (char *)(ulong)uVar20;
                          if (pcVar30 <= path) break;
                          cVar1 = *pcVar30;
                          pcVar30 = pcVar30 + -1;
                        } while (cVar1 != '/');
                        pEStack_42a0 = (Elf64_Ehdr *)0x12ad68;
                        mg_snprintf((mg_connection *)thread_func_param,&local_4264,(char *)&vec,
                                    0x1000,"%.*s/%s",pcVar38,path);
                      }
                      else {
                        pcVar38 = path;
                        mg_snprintf((mg_connection *)thread_func_param,&local_4264,(char *)&vec,
                                    0x1000,"%s/%s",pcVar38,".htpasswd");
                      }
                      pmVar46 = (mg_connection *)&vec;
                      if (local_4264 == 0) goto LAB_00115c70;
                    }
                    else {
LAB_00115c70:
                      mg_fopen(pmVar46,(char *)0x1,(int)&file,(mg_file *)pEStack_42a0);
                    }
                    if (file.access.fp == (FILE *)0x0) goto LAB_001157b5;
                  }
                  iVar19 = authorize((mg_connection *)thread_func_param,&file,(char *)0x0);
                  mg_fclose(&file.access);
                  if (iVar19 != 0) goto LAB_001157b5;
                }
                send_authorization_request((mg_connection *)thread_func_param,(char *)0x0);
LAB_001159be:
                release_handler_ref((mg_connection *)thread_func_param,handler_info);
              }
              else {
                pEStack_42a0 = *(Elf64_Ehdr **)((long)thread_func_param + 0x10);
                iVar19 = 0x195;
                pcVar30 = "%s method not allowed";
LAB_00115953:
                mg_send_http_error((mg_connection *)thread_func_param,iVar19,pcVar30);
              }
              goto LAB_001159cb;
            }
            iVar19 = (*auth_handler)((mg_connection *)thread_func_param,auth_callback_data);
            if (iVar19 == 0) goto LAB_001159be;
LAB_001157b5:
            if (bVar16) {
              iVar19 = 0x194;
              pcVar30 = "%s";
              pEStack_42a0 = (Elf64_Ehdr *)0x1287a0;
              goto LAB_00115953;
            }
            if (!bVar51) goto LAB_001159cb;
            iVar19 = (*callback_handler)((mg_connection *)thread_func_param,callback_data);
            release_handler_ref((mg_connection *)thread_func_param,handler_info);
            if (0 < iVar19) {
              *(int *)((long)thread_func_param + 0x99c) = iVar19;
              goto LAB_00114d78;
            }
            callback_handler = (mg_request_handler)0x0;
LAB_00115632:
            path[0] = '\0';
            iVar19 = is_put_or_delete_method((mg_connection *)thread_func_param);
            local_4270 = (Elf64_Ehdr *)CONCAT44(local_4270._4_4_,iVar19);
            pEStack_42a0 = *(Elf64_Ehdr **)((long)thread_func_param + 0x10);
            bVar51 = true;
            if (pEStack_42a0 != (Elf64_Ehdr *)0x0) {
              iVar19 = strcmp((char *)pEStack_42a0,"PROPFIND");
              bVar51 = false;
              if (iVar19 != 0) {
                iVar19 = strcmp((char *)pEStack_42a0,"PROPPATCH");
                bVar51 = false;
                if (iVar19 != 0) {
                  iVar19 = strcmp((char *)pEStack_42a0,"LOCK");
                  bVar51 = false;
                  if (iVar19 != 0) {
                    iVar19 = strcmp((char *)pEStack_42a0,"UNLOCK");
                    bVar51 = false;
                    if (iVar19 != 0) {
                      iVar19 = strcmp((char *)pEStack_42a0,"MOVE");
                      bVar51 = false;
                      if (iVar19 != 0) {
                        iVar19 = strcmp((char *)pEStack_42a0,"COPY");
                        bVar51 = iVar19 != 0;
                      }
                    }
                  }
                }
              }
            }
            *(undefined4 *)((long)thread_func_param + 0x984) = 0;
            pcVar30 = mg_get_header((mg_connection *)thread_func_param,"Accept-Encoding");
            if ((pcVar30 != (char *)0x0) &&
               (pcVar30 = strstr(pcVar30,"gzip"), pcVar30 != (char *)0x0)) {
              *(undefined4 *)((long)thread_func_param + 0x984) = 1;
            }
            bVar16 = true;
            bVar15 = false;
            if (bVar51) {
              bVar51 = true;
              bVar16 = true;
              goto LAB_0011574e;
            }
            bVar15 = false;
            bVar51 = true;
          } while (**(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x118) == 'y');
          mg_send_http_error((mg_connection *)thread_func_param,0x195,"%s method not allowed");
        }
        else {
          iVar19 = (*pcVar5)(thread_func_param);
          if (iVar19 < 1) {
            if (iVar19 == 0) goto LAB_00114f0f;
          }
          else {
            *(int *)((long)thread_func_param + 0x99c) = iVar19;
LAB_00114d78:
            if (*(int *)((long)thread_func_param + 0x980) == 0) {
              discard_unread_request_data((mg_connection *)thread_func_param);
            }
          }
        }
      }
    }
LAB_001159cb:
    pcVar5 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28318);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(thread_func_param);
    }
    if (*(long *)((long)thread_func_param + 0x8e8) != 0) {
      vec.ptr = (char *)((ulong)vec.ptr & 0xffffffffffffff00);
      pmVar46 = *(mg_connection **)(*(long *)((long)thread_func_param + 0x8e8) + 0x88);
      if ((pmVar46 == (mg_connection *)0x0) ||
         (iVar19 = mg_fopen(pmVar46,(char *)0x4,(int)&file,(mg_file *)pEStack_42a0), iVar19 == 0)) {
        file.access.fp = (FILE *)0x0;
LAB_00115a2f:
        if (*(long *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328) == 0) goto LAB_00114778;
      }
      else if (file.access.fp == (FILE *)0x0) goto LAB_00115a2f;
      __tp = localtime(local_41d8);
      if (__tp == (tm *)0x0) {
        mg_strlcpy((char *)&val,"01/Jan/1970:00:00:00 +0000",0x40);
      }
      else {
        strftime((char *)&val,0x40,"%d/%b/%Y:%H:%M:%S %z",__tp);
      }
      sockaddr_to_string(path,0x32,local_4220);
      pcVar31 = header_val((mg_connection *)thread_func_param,"Referer");
      pcVar36 = header_val((mg_connection *)thread_func_param,"User-Agent");
      pcVar30 = *(char **)((long)thread_func_param + 0x40);
      if (pcVar30 == (char *)0x0) {
        pcVar30 = "-";
      }
      pcVar49 = *(char **)((long)thread_func_param + 0x10);
      pcVar44 = *(char **)((long)thread_func_param + 0x18);
      if (pcVar49 == (char *)0x0) {
        pcVar49 = "-";
      }
      if (pcVar44 == (char *)0x0) {
        pcVar44 = "-";
      }
      pcVar45 = *(char **)((long)thread_func_param + 0x38);
      pcVar48 = "?";
      if (pcVar45 == (char *)0x0) {
        pcVar48 = "";
        pcVar45 = "";
      }
      uVar20 = 0x1000;
      pcVar38 = path;
      mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,(char *)&vec,0x1000,
                  "%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d %ld %s %s",pcVar38,pcVar30,&val,pcVar49,
                  pcVar44,pcVar48,pcVar45,*(undefined8 *)((long)thread_func_param + 0x30),
                  (ulong)*(uint *)((long)thread_func_param + 0x99c),
                  *(undefined8 *)((long)thread_func_param + 0x950),pcVar31,pcVar36);
      pcVar5 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328);
      if ((pcVar5 == (code *)0x0) || (iVar19 = (*pcVar5)(thread_func_param), iVar19 == 0)) {
        if (file.access.fp != (FILE *)0x0) {
          flockfile((FILE *)file.access.fp);
          iVar19 = fprintf((FILE *)file.access.fp,"%s\n",&vec);
          iVar21 = fflush((FILE *)file.access.fp);
          funlockfile((FILE *)file.access.fp);
          iVar22 = mg_fclose(&file.access);
          if ((iVar19 < 1) || (iVar22 != 0 || iVar21 != 0)) {
            pcVar38 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x88);
            mg_cry_internal_wrap
                      ((mg_connection *)thread_func_param,(mg_context *)0x0,func_02,uVar20,
                       "Error writing log file %s");
          }
        }
      }
      else if (file.access.fp != (FILE *)0x0) {
        mg_fclose(&file.access);
      }
    }
  }
  else {
LAB_00114768:
    *(undefined4 *)((long)thread_func_param + 4) = 0xffffffff;
LAB_0011476d:
    *(undefined4 *)((long)thread_func_param + 0x980) = 1;
  }
LAB_00114778:
  free_buffered_response_header_list((mg_connection *)thread_func_param);
  in_R9 = pcVar38;
  if (*(void **)((long)thread_func_param + 0x40) != (void *)0x0) {
    free(*(void **)((long)thread_func_param + 0x40));
    *(undefined8 *)((long)thread_func_param + 0x40) = 0;
    in_R9 = pcVar38;
  }
  __mutex = local_41a8;
  __cond = local_41b0;
  if ((((*(int *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28) == 0) &&
       (iVar19 = should_keep_alive((mg_connection *)thread_func_param), iVar19 != 0)) &&
      (lVar24 = *(long *)((long)thread_func_param + 0x958), -1 < lVar24)) &&
     (lVar39 = (long)*(int *)((long)thread_func_param + 0x994), 0 < lVar39)) {
    if (*(int *)((long)thread_func_param + 0x968) != 4) {
      if (*(int *)((long)thread_func_param + 0x968) != 0) goto LAB_001147b0;
      if ((*(long *)((long)thread_func_param + 0x960) != lVar24) &&
         (uVar20 = *(uint *)((long)thread_func_param + 0x998), (long)(int)uVar20 < lVar24 + lVar39))
      {
        bVar15 = false;
        goto LAB_001147b9;
      }
    }
    if (*(int *)((long)thread_func_param + 4) != 0) goto LAB_001147b0;
    iVar19 = *(int *)((long)thread_func_param + 0x998);
    iVar21 = (int)(lVar24 + lVar39);
    if ((long)iVar19 <= lVar24 + lVar39) {
      iVar21 = iVar19;
    }
    uVar20 = iVar19 - iVar21;
    *(uint *)((long)thread_func_param + 0x998) = uVar20;
    if (uVar20 == 0 || iVar19 < iVar21) {
      bVar15 = true;
      goto LAB_001147b9;
    }
    memmove(*(void **)((long)thread_func_param + 0x970),
            (void *)((long)iVar21 + (long)*(void **)((long)thread_func_param + 0x970)),(ulong)uVar20
           );
    bVar15 = true;
  }
  else {
LAB_001147b0:
    bVar15 = false;
  }
  uVar20 = *(uint *)((long)thread_func_param + 0x998);
LAB_001147b9:
  if ((((int)uVar20 < 0) || (*(int *)((long)thread_func_param + 0x990) < (int)uVar20)) ||
     (*(int *)((long)thread_func_param + 0x98c) = *(int *)((long)thread_func_param + 0x98c) + 1,
     !bVar15)) goto LAB_00115d6e;
  goto LAB_0011458f;
LAB_00115d6e:
  close_connection((mg_connection *)thread_func_param);
  goto LAB_001143c6;
}

Assistant:

static void *
worker_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	worker_thread_run((struct mg_connection *)thread_func_param);
	return NULL;
}